

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O1

void uavs3d_ipred_ang_y_32_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  pel *ppVar3;
  undefined1 uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong *puVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  undefined1 (*pauVar17) [16];
  undefined1 *puVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 uStack_129;
  undefined8 auStack_128 [33];
  undefined1 auVar29 [32];
  undefined1 auVar32 [32];
  
  uVar14 = height / 2;
  uVar15 = (uVar14 + width) - 1;
  uVar5 = height;
  if ((int)uVar15 < height) {
    uVar5 = uVar15;
  }
  uVar20 = (long)(int)(uVar14 + width + 0x3e) & 0xfffffffffffffff0;
  if ((int)uVar5 < 5) {
    pauVar17 = (undefined1 (*) [16])(src + -0x12);
    uVar21 = 0;
  }
  else {
    uVar21 = 0;
    auVar24._8_2_ = 2;
    auVar24._0_8_ = 0x2000200020002;
    auVar24._10_2_ = 2;
    auVar24._12_2_ = 2;
    auVar24._14_2_ = 2;
    auVar24._16_2_ = 2;
    auVar24._18_2_ = 2;
    auVar24._20_2_ = 2;
    auVar24._22_2_ = 2;
    auVar24._24_2_ = 2;
    auVar24._26_2_ = 2;
    auVar24._28_2_ = 2;
    auVar24._30_2_ = 2;
    puVar13 = (ulong *)(src + -9);
    do {
      puVar16 = puVar13;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)((long)puVar16 + -2);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)((long)puVar16 + -10);
      auVar26._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar22;
      auVar26._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)((long)puVar16 + -1);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)((long)puVar16 + -9);
      auVar29._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar28;
      auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *puVar16;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = puVar16[-1];
      auVar32._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar31;
      auVar32._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33;
      auVar23 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar26 = vpunpcklbw_avx2(auVar26,auVar23);
      auVar29 = vpunpcklbw_avx2(auVar29,auVar23);
      auVar23 = vpunpcklbw_avx2(auVar32,auVar23);
      auVar26 = vpaddw_avx2(auVar26,auVar23);
      auVar29 = vpaddw_avx2(auVar29,auVar29);
      auVar26 = vpaddw_avx2(auVar26,auVar29);
      auVar26 = vpaddw_avx2(auVar26,auVar24);
      auVar26 = vpsrlw_avx2(auVar26,2);
      auVar22 = vpackuswb_avx(auVar26._0_16_,auVar26._16_16_);
      auVar27 = vpshufb_avx(auVar22,ZEXT816(0x1030507090b0d0f));
      auVar22 = vpshufb_avx(auVar22,ZEXT816(0x20406080a0c0e));
      *(long *)((long)auStack_128 + uVar21) = auVar27._0_8_;
      *(long *)((long)auStack_128 + uVar21 + uVar20) = auVar22._0_8_;
      uVar21 = uVar21 + 8;
      puVar13 = puVar16 + -2;
    } while ((long)uVar21 < (long)(int)(uVar5 - 4));
    pauVar17 = (undefined1 (*) [16])((long)puVar16 + -0x19);
  }
  if ((int)uVar21 < (int)uVar5) {
    auVar22 = vpunpckhbw_avx(*(undefined1 (*) [16])(pauVar17[-1] + 0xf),(undefined1  [16])0x0);
    auVar27 = vpunpckhbw_avx(*pauVar17,(undefined1  [16])0x0);
    auVar28 = vpunpckhbw_avx(*(undefined1 (*) [16])(*pauVar17 + 1),(undefined1  [16])0x0);
    auVar22 = vpaddw_avx(auVar28,auVar22);
    auVar27 = vpaddw_avx(auVar27,auVar27);
    auVar25._8_2_ = 2;
    auVar25._0_8_ = 0x2000200020002;
    auVar25._10_2_ = 2;
    auVar25._12_2_ = 2;
    auVar25._14_2_ = 2;
    auVar22 = vpaddw_avx(auVar22,auVar27);
    auVar22 = vpaddw_avx(auVar22,auVar25);
    auVar22 = vpsrlw_avx(auVar22,2);
    auVar22 = vpackuswb_avx(auVar22,auVar22);
    auVar27 = vpshufb_avx(auVar22,_DAT_0017f140);
    auVar22 = vpshufb_avx(auVar22,_DAT_0017f150);
    *(int *)((long)auStack_128 + (uVar21 & 0xffffffff)) = auVar22._0_4_;
    *(int *)((long)auStack_128 + (uVar21 & 0xffffffff) + uVar20) = auVar27._0_4_;
  }
  if (height < (int)uVar15) {
    uVar4 = (&uStack_129)[(long)(int)uVar5 + uVar20];
    puVar18 = (undefined1 *)((long)auStack_128 + (long)height);
    iVar19 = ~uVar5 + uVar14 + width;
    do {
      *puVar18 = uVar4;
      puVar18[1] = uVar4;
      puVar18[2] = uVar4;
      puVar18[3] = uVar4;
      puVar18[4] = uVar4;
      puVar18[5] = uVar4;
      puVar18[6] = uVar4;
      puVar18[7] = uVar4;
      puVar18[8] = uVar4;
      puVar18[9] = uVar4;
      puVar18[10] = uVar4;
      puVar18[0xb] = uVar4;
      puVar18[0xc] = uVar4;
      puVar18[0xd] = uVar4;
      puVar18[0xe] = uVar4;
      puVar18[0xf] = uVar4;
      puVar1 = puVar18 + uVar20;
      *puVar1 = uVar4;
      puVar1[1] = uVar4;
      puVar1[2] = uVar4;
      puVar1[3] = uVar4;
      puVar1[4] = uVar4;
      puVar1[5] = uVar4;
      puVar1[6] = uVar4;
      puVar1[7] = uVar4;
      puVar1[8] = uVar4;
      puVar1[9] = uVar4;
      puVar1[10] = uVar4;
      puVar1[0xb] = uVar4;
      puVar1[0xc] = uVar4;
      puVar1[0xd] = uVar4;
      puVar1[0xe] = uVar4;
      puVar1[0xf] = uVar4;
      puVar18 = puVar18 + 1;
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  iVar19 = i_dst * 2;
  if (width < 0x10) {
    if (width == 4) {
      if (1 < height) {
        uVar21 = 0;
        do {
          *(undefined4 *)dst = *(undefined4 *)((long)auStack_128 + uVar21);
          *(undefined4 *)(dst + i_dst) = *(undefined4 *)((long)auStack_128 + uVar21 + uVar20);
          dst = dst + iVar19;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
    }
    else if ((width == 8) && (1 < height)) {
      uVar21 = 0;
      do {
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_128 + uVar21);
        *(undefined8 *)(dst + i_dst) = *(undefined8 *)((long)auStack_128 + uVar21 + uVar20);
        dst = dst + iVar19;
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
    }
  }
  else if (width == 0x10) {
    if (1 < height) {
      uVar21 = 0;
      do {
        uVar6 = *(undefined8 *)((long)auStack_128 + uVar21 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_128 + uVar21);
        *(undefined8 *)(dst + 8) = uVar6;
        puVar2 = (undefined8 *)((long)auStack_128 + uVar21 + uVar20);
        uVar6 = puVar2[1];
        *(undefined8 *)(dst + i_dst) = *puVar2;
        *(undefined8 *)(dst + i_dst + 8) = uVar6;
        dst = dst + iVar19;
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
    }
  }
  else if (width == 0x20) {
    if (1 < height) {
      uVar21 = 0;
      do {
        uVar6 = *(undefined8 *)((long)auStack_128 + uVar21 + 8);
        uVar7 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x10);
        uVar8 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_128 + uVar21);
        *(undefined8 *)(dst + 8) = uVar6;
        *(undefined8 *)(dst + 0x10) = uVar7;
        *(undefined8 *)(dst + 0x18) = uVar8;
        puVar2 = (undefined8 *)((long)auStack_128 + uVar21 + uVar20);
        uVar6 = puVar2[1];
        uVar7 = puVar2[2];
        uVar8 = puVar2[3];
        ppVar3 = dst + i_dst;
        *(undefined8 *)ppVar3 = *puVar2;
        *(undefined8 *)(ppVar3 + 8) = uVar6;
        *(undefined8 *)(ppVar3 + 0x10) = uVar7;
        *(undefined8 *)(ppVar3 + 0x18) = uVar8;
        dst = dst + iVar19;
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
    }
  }
  else if ((width == 0x40) && (1 < height)) {
    uVar21 = 0;
    do {
      uVar6 = *(undefined8 *)((long)auStack_128 + uVar21);
      uVar7 = *(undefined8 *)((long)auStack_128 + uVar21 + 8);
      uVar8 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x10);
      uVar9 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x18);
      uVar10 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x28);
      uVar11 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x30);
      uVar12 = *(undefined8 *)((long)auStack_128 + uVar21 + 0x38);
      *(undefined8 *)(dst + 0x20) = *(undefined8 *)((long)auStack_128 + uVar21 + 0x20);
      *(undefined8 *)(dst + 0x28) = uVar10;
      *(undefined8 *)(dst + 0x30) = uVar11;
      *(undefined8 *)(dst + 0x38) = uVar12;
      *(undefined8 *)dst = uVar6;
      *(undefined8 *)(dst + 8) = uVar7;
      *(undefined8 *)(dst + 0x10) = uVar8;
      *(undefined8 *)(dst + 0x18) = uVar9;
      puVar2 = (undefined8 *)((long)auStack_128 + uVar21 + uVar20);
      uVar6 = *puVar2;
      uVar7 = puVar2[1];
      uVar8 = puVar2[2];
      uVar9 = puVar2[3];
      puVar2 = (undefined8 *)((long)auStack_128 + uVar21 + uVar20 + 0x20);
      uVar10 = puVar2[1];
      uVar11 = puVar2[2];
      uVar12 = puVar2[3];
      ppVar3 = dst + (long)i_dst + 0x20;
      *(undefined8 *)ppVar3 = *puVar2;
      *(undefined8 *)(ppVar3 + 8) = uVar10;
      *(undefined8 *)(ppVar3 + 0x10) = uVar11;
      *(undefined8 *)(ppVar3 + 0x18) = uVar12;
      ppVar3 = dst + i_dst;
      *(undefined8 *)ppVar3 = uVar6;
      *(undefined8 *)(ppVar3 + 8) = uVar7;
      *(undefined8 *)(ppVar3 + 0x10) = uVar8;
      *(undefined8 *)(ppVar3 + 0x18) = uVar9;
      dst = dst + iVar19;
      uVar21 = uVar21 + 1;
    } while (uVar14 != uVar21);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_y_32_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[2 * (64 + 64)]);
    int line_size = height / 2 + width - 1;
    int real_size = COM_MIN(line_size, height);
    int i;
    __m128i pad_val;
    int aligned_line_size = ((line_size + 63) >> 4) << 4;
    pel *pfirst[2];
    __m256i coeff2 = _mm256_set1_epi16(2);
    __m256i zero = _mm256_setzero_si256();
    __m128i shuffle1 = _mm_setr_epi8(15, 13, 11, 9, 7, 5, 3, 1, 14, 12, 10, 8, 6, 4, 2, 0);
    __m128i shuffle2 = _mm_setr_epi8(14, 12, 10, 8, 6, 4, 2, 0, 15, 13, 11, 9, 7, 5, 3, 1);
    int i_dst2 = i_dst * 2;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

    src -= 18;

    for (i = 0; i < real_size - 4; i += 8, src -= 16) {
        __m256i p0, p1;
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);
        __m128i m0, d0, d1;

        p0 = _mm256_add_epi16(L0, L1);
        p1 = _mm256_add_epi16(L1, L2);
        p0 = _mm256_add_epi16(p0, coeff2);
        p0 = _mm256_add_epi16(p0, p1);
        p0 = _mm256_srli_epi16(p0, 2);

        m0 = _mm_packus_epi16(_mm256_castsi256_si128(p0), _mm256_extracti128_si256(p0, 1));
        d0 = _mm_shuffle_epi8(m0, shuffle1);
        d1 = _mm_shuffle_epi8(m0, shuffle2);
        _mm_storel_epi64((__m128i *)&pfirst[0][i], d0);
        _mm_storel_epi64((__m128i *)&pfirst[1][i], d1);
    }

    if (i < real_size) {
        __m128i coeff2 = _mm_set1_epi16(2);
        __m128i zero = _mm_setzero_si128();
        __m128i p10, p11;
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i H0 = _mm_unpackhi_epi8(S0, zero);
        __m128i H1 = _mm_unpackhi_epi8(S1, zero);
        __m128i H2 = _mm_unpackhi_epi8(S2, zero);

        p10 = _mm_add_epi16(H0, H1);
        p11 = _mm_add_epi16(H1, H2);
        p10 = _mm_add_epi16(p10, coeff2);
        p10 = _mm_add_epi16(p10, p11);
        p10 = _mm_srli_epi16(p10, 2);

        p11 = _mm_packus_epi16(p10, p10);
        p10 = _mm_shuffle_epi8(p11, shuffle2);
        p11 = _mm_shuffle_epi8(p11, shuffle1);
        ((int *)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p11);
        ((int *)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p10);
    }

    // padding
    if (real_size < line_size) {
        pad_val = _mm_set1_epi8((char)pfirst[1][real_size - 1]);
        for (i = real_size; i < line_size; i++) {
            _mm_storeu_si128((__m128i *)&pfirst[0][i], pad_val);
            _mm_storeu_si128((__m128i *)&pfirst[1][i], pad_val);
        }
    }

    height /= 2;

#define COPY_Y32(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, pfirst[0] + i, w * sizeof(pel)); \
        memcpy(dst + i_dst, pfirst[1] + i, w * sizeof(pel)); \
        dst += i_dst2;\
    } \
}
    switch (width) {
    case 4:
        COPY_Y32(4)
            break;
    case 8:
        COPY_Y32(8)
            break;
    case 16:
        COPY_Y32(16)
            break;
    case 32:
        COPY_Y32(32)
            break;
    case 64:
        COPY_Y32(64)
            break;
    }
}